

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngtest.c
# Opt level: O2

void write_chunks(png_structp write_ptr,user_chunk_info *data,int location)

{
  long lVar1;
  undefined4 local_54;
  undefined1 local_50 [4];
  png_byte local_4c;
  png_byte vpAg [5];
  
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    if (data->location[lVar1] == (location | 1U)) {
      local_50[0] = 0;
      local_54 = 0x52455473;
      if (verbose == '\x01') {
        fprintf(_stdout,"\n stereo mode = %d\n",(ulong)data->sTER_mode);
      }
      png_write_chunk(write_ptr,&local_54,&data->sTER_mode,1);
    }
    else if (data->location[lVar1] == (location | 2U)) {
      builtin_memcpy(vpAg,"vpAg",5);
      if (verbose == '\x01') {
        fprintf(_stdout," vpAg = %lu x %lu, units = %d\n",(ulong)data->vpAg_width,
                (ulong)data->vpAg_height,(ulong)data->vpAg_units);
      }
      png_save_uint_32(&local_54,data->vpAg_width);
      png_save_uint_32(local_50,data->vpAg_height);
      local_4c = data->vpAg_units;
      png_write_chunk(write_ptr,vpAg,&local_54,9);
    }
  }
  return;
}

Assistant:

static void
write_chunks(png_structp write_ptr, user_chunk_info *data, int location)
{
   int i;

   /* Notice that this preserves the original chunk order, however chunks
    * intercepted by the callback will be written *after* chunks passed to
    * libpng.  This will actually reverse a pair of sTER chunks or a pair of
    * vpAg chunks, resulting in an error later.  This is not worth worrying
    * about - the chunks should not be duplicated!
    */
   for (i = 0; i < 2; ++i)
   {
      if (data->location[i] == (location | have_sTER))
         write_sTER_chunk(write_ptr, data);

      else if (data->location[i] == (location | have_vpAg))
         write_vpAg_chunk(write_ptr, data);
   }
}